

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMatrix.cpp
# Opt level: O0

void __thiscall HMatrix::rp_mtx(HMatrix *this)

{
  value_type vVar1;
  reference pvVar2;
  reference pvVar3;
  int *in_RDI;
  int k_2;
  int k_1;
  int k;
  int i_1;
  int i;
  vector<double,_std::allocator<double>_> rp_mtx_r;
  size_type in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int iVar4;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  int local_48;
  int local_44;
  int local_40;
  uint local_3c;
  uint local_38;
  vector<double,_std::allocator<double>_> local_20;
  
  if (in_RDI[1] + *in_RDI < 0x15) {
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x170c41);
    std::vector<double,_std::allocator<double>_>::assign
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff88,(value_type_conflict1 *)0x170c61);
    printf("\nRow-wise matrix\n");
    printf("         ");
    for (local_38 = 0; (int)local_38 < *in_RDI; local_38 = local_38 + 1) {
      printf(" %8d",(ulong)local_38);
    }
    printf("\n");
    for (local_3c = 0; (int)local_3c < in_RDI[1]; local_3c = local_3c + 1) {
      printf(" Row %2d: ",(ulong)local_3c);
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x14),(long)(int)local_3c);
      local_40 = *pvVar2;
      while (in_stack_ffffffffffffffa4 = local_40,
            pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1a),
                                (long)(int)local_3c), in_stack_ffffffffffffffa4 < *pvVar2) {
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x26),
                            (long)local_40);
        vVar1 = *pvVar3;
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20),(long)local_40);
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_20,(long)*pvVar2);
        *pvVar3 = vVar1;
        local_40 = local_40 + 1;
      }
      for (local_44 = 0; local_44 < *in_RDI; local_44 = local_44 + 1) {
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_20,(long)local_44);
        printf(" %8g",*pvVar3);
      }
      printf("\n");
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x14),(long)(int)local_3c);
      local_48 = *pvVar2;
      while (iVar4 = local_48,
            pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1a),
                                (long)(int)local_3c), iVar4 < *pvVar2) {
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20),(long)local_48);
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_20,(long)*pvVar2);
        *pvVar3 = 0.0;
        local_48 = local_48 + 1;
      }
    }
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  }
  return;
}

Assistant:

void HMatrix::rp_mtx() {
	if (numRow+numCol>20) return;
    vector<double> rp_mtx_r;
    rp_mtx_r.assign(numCol, 0);

	printf("\nRow-wise matrix\n");
	printf("         ");
	for (int i = 0; i < numCol; i++) {
		printf(" %8d", i);
	}
	printf("\n");

    for (int i = 0; i < numRow; i++) {
		printf(" Row %2d: ", i);
        for (int k = ARstart[i]; k < AR_Nend[i]; k++) {
        	rp_mtx_r[ARindex[k]] = ARvalue[k];
        }
        for (int k = 0; k < numCol; k++) {
        	printf(" %8g", rp_mtx_r[k]);
        }
    	printf("\n");
        for (int k = ARstart[i]; k < AR_Nend[i]; k++) {
        	 rp_mtx_r[ARindex[k]] = 0;
        }
    }

}